

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GeneratePBHeader
          (FileGenerator *this,Printer *printer,string *info_path)

{
  string *psVar1;
  char *__rhs;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string filename_identifier;
  string *info_path_local;
  Printer *printer_local;
  FileGenerator *this_local;
  
  filename_identifier.field_2._8_8_ = info_path;
  psVar1 = FileDescriptor::name_abi_cxx11_(this->file_);
  __rhs = "";
  if (((this->options_).proto_h & 1U) != 0) {
    __rhs = ".pb.h";
  }
  std::operator+(&local_60,psVar1,__rhs);
  FilenameIdentifier((string *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  GenerateTopHeaderGuard(this,printer,(string *)local_40);
  if (((this->options_).proto_h & 1U) == 0) {
    GenerateLibraryIncludes(this,printer);
  }
  else {
    psVar1 = FileDescriptor::name_abi_cxx11_(this->file_);
    StripProto(&local_90,psVar1);
    io::Printer::Print(printer,"#include \"$basename$.proto.h\"  // IWYU pragma: export\n",
                       "basename",&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  GenerateDependencyIncludes(this,printer);
  GenerateMetadataPragma(this,printer,(string *)filename_identifier.field_2._8_8_);
  if (((this->options_).proto_h & 1U) == 0) {
    GenerateHeader(this,printer);
  }
  else {
    io::Printer::Print(printer,"// @@protoc_insertion_point(includes)\n");
    GenerateNamespaceOpeners(this,printer);
    io::Printer::Print(printer,"\n// @@protoc_insertion_point(namespace_scope)\n");
    GenerateNamespaceClosers(this,printer);
    io::Printer::Print(printer,"\n// @@protoc_insertion_point(global_scope)\n\n");
  }
  GenerateBottomHeaderGuard(this,printer,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void FileGenerator::GeneratePBHeader(io::Printer* printer,
                                     const string& info_path) {
  string filename_identifier =
      FilenameIdentifier(file_->name() + (options_.proto_h ? ".pb.h" : ""));
  GenerateTopHeaderGuard(printer, filename_identifier);

  if (options_.proto_h) {
    printer->Print("#include \"$basename$.proto.h\"  // IWYU pragma: export\n",
                   "basename", StripProto(file_->name()));
  } else {
    GenerateLibraryIncludes(printer);
  }

  GenerateDependencyIncludes(printer);
  GenerateMetadataPragma(printer, info_path);

  if (!options_.proto_h) {
    GenerateHeader(printer);
  } else {
    // This is unfortunately necessary for some plugins. I don't see why we
    // need two of the same insertion points.
    // TODO(gerbens) remove this.
    printer->Print(
      "// @@protoc_insertion_point(includes)\n");

    // Open namespace.
    GenerateNamespaceOpeners(printer);
    printer->Print(
      "\n"
      "// @@protoc_insertion_point(namespace_scope)\n");
    // Close up namespace.
    GenerateNamespaceClosers(printer);

    printer->Print(
      "\n"
      "// @@protoc_insertion_point(global_scope)\n"
      "\n");
  }

  GenerateBottomHeaderGuard(printer, filename_identifier);
}